

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabledtest.cpp
# Opt level: O2

void __thiscall
iu_EnabledTest_x_iutest_x_Enable_Test::Body(iu_EnabledTest_x_iutest_x_Enable_Test *this)

{
  int *in_R9;
  iuCodeMessage local_1e8;
  AssertionResult iutest_ar;
  Fixed local_190;
  
  local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
  local_1e8.m_message._M_dataplus._M_p._0_4_ = 0;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x2028d0,"0",(char *)&local_190,(int *)&local_1e8,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/disabledtest.cpp"
               ,0x32,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_190);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(DISABLED_MacroTest, Enable)
{
    IUTEST_ASSERT_EQ(0, 0);
}